

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_arccurve.cpp
# Opt level: O3

bool __thiscall ON_ArcCurve::Read(ON_ArcCurve *this,ON_BinaryArchive *file)

{
  bool bVar1;
  int major_version;
  int minor_version;
  int local_20 [2];
  
  local_20[0] = 0;
  local_20[1] = 0;
  bVar1 = ON_BinaryArchive::Read3dmChunkVersion(file,local_20,local_20 + 1);
  if (!bVar1) {
    return false;
  }
  if (local_20[0] == 1) {
    bVar1 = ON_BinaryArchive::ReadArc(file,&this->m_arc);
    if ((bVar1) && (bVar1 = ON_BinaryArchive::ReadInterval(file,&this->m_t), bVar1)) {
      bVar1 = ON_BinaryArchive::ReadInt(file,&this->m_dim);
    }
    else {
      bVar1 = false;
    }
    if ((this->m_dim & 0xfffffffeU) != 2) {
      this->m_dim = 3;
    }
    return bVar1;
  }
  return false;
}

Assistant:

bool ON_ArcCurve::Read(
       ON_BinaryArchive& file // open binary file
     )
{
  int major_version = 0;
  int minor_version = 0;
  bool rc = file.Read3dmChunkVersion(&major_version,&minor_version);
  if (rc)
  {
    if (major_version==1) 
    {
      // common to all 1.x  versions
      rc = file.ReadArc( m_arc );
      if (rc) 
        rc = file.ReadInterval( m_t );
      if (rc) 
        rc = file.ReadInt(&m_dim);
      if ( m_dim != 2 && m_dim != 3 )
        m_dim = 3;
    }
    else
      rc = 0;
  }
  return rc;
}